

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O3

bool anon_unknown.dwarf_2c27f::push_pull(EmulateRegisters *regs,Operation op)

{
  byte bVar1;
  Pointer PVar2;
  ushort uVar3;
  memoryAccessFunc p_Var4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint8_t uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  
  switch(op) {
  case PHA:
    uVar3 = regs->_A;
    uVar7 = (uint)uVar3;
    if ((regs->_P & 0x20) != 0) goto LAB_0012d5f8;
    uVar5 = regs->_S;
    goto LAB_0012d716;
  case PHB:
    regs->used_DB = true;
    uVar8 = regs->_DB;
    uVar3 = regs->_S;
    if (regs->_write_function != (memoryAccessFunc)0x0) {
      PVar2 = (Pointer)((ulong)uVar3 | 0x7e0000);
      (*regs->_write_function)(regs->_callback_context,PVar2,PVar2,(uint32_t)uVar8,1,STACK_RELATIVE)
      ;
    }
    regs->_memory[(ulong)uVar3 | 0x7e0000] = uVar8;
    goto LAB_0012d987;
  case PHD:
    regs->used_DP = true;
    uVar3 = regs->_DP;
    goto LAB_0012d704;
  case PHK:
    uVar7 = regs->_PC >> 0x10;
LAB_0012d5f8:
    uVar8 = (uint8_t)uVar7;
    uVar3 = regs->_S;
    uVar11 = (ulong)uVar3 | 0x7e0000;
    p_Var4 = regs->_write_function;
    if (p_Var4 != (memoryAccessFunc)0x0) {
      pvVar10 = regs->_callback_context;
LAB_0012d96b:
      uVar8 = (uint8_t)uVar7;
      (*p_Var4)(pvVar10,(Pointer)uVar11,(Pointer)uVar11,uVar7 & 0xff,1,STACK_RELATIVE);
    }
    goto LAB_0012d97f;
  case PHP:
    uVar7 = (uint)regs->_P;
LAB_0012d94b:
    uVar8 = (uint8_t)uVar7;
    uVar3 = regs->_S;
    uVar11 = (ulong)uVar3 | 0x7e0000;
    p_Var4 = regs->_write_function;
    if (p_Var4 != (memoryAccessFunc)0x0) {
      pvVar10 = regs->_callback_context;
      goto LAB_0012d96b;
    }
LAB_0012d97f:
    regs->_memory[uVar11] = uVar8;
LAB_0012d987:
    regs->_S = uVar3 - 1;
    break;
  case PHX:
    if ((regs->_P & 0x10) != 0) {
      *(undefined1 *)&regs->used_X_mask = 0xff;
      uVar7 = (uint)regs->_X;
      goto LAB_0012d94b;
    }
    regs->used_X_mask = 0xffff;
    uVar3 = regs->_X;
    goto LAB_0012d704;
  case PHY:
    if ((regs->_P & 0x10) != 0) {
      *(undefined1 *)&regs->used_Y_mask = 0xff;
      uVar7 = (uint)regs->_Y;
      goto LAB_0012d94b;
    }
    regs->used_Y_mask = 0xffff;
    uVar3 = regs->_Y;
LAB_0012d704:
    uVar5 = regs->_S;
LAB_0012d716:
    snestistics::EmulateRegisters::write_word(regs,uVar5 - 1 | 0x7e0000,uVar3,STACK_RELATIVE);
    regs->_S = uVar5 - 2;
    break;
  case PLA:
    if ((regs->_P & 0x20) == 0) {
      uVar3 = regs->_S + 2;
      regs->_S = uVar3;
      uVar9 = uVar3 - 1;
      uVar7 = uVar9 & 0xffffff | 0x7e0000;
      uVar3 = *(ushort *)(regs->_memory + uVar7);
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar9 | 0x7e0000,uVar7,(uint32_t)uVar3,2,STACK_RELATIVE);
      }
      uVar6 = (uVar3 >> 8 & 0x80) + (ushort)(uVar3 == 0) * 2;
      uVar5 = 0xffff;
    }
    else {
      uVar5 = regs->_S + 1;
      regs->_S = uVar5;
      bVar1 = regs->_memory[(ulong)uVar5 + 0x7e0000];
      uVar3 = (ushort)bVar1;
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar5 | 0x7e0000,uVar5 | 0x7e0000,(uint32_t)bVar1,1,
                   STACK_RELATIVE);
      }
      uVar6 = (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
      uVar5 = 0xff;
    }
    regs->_P = uVar6 | regs->_P & 0xff7d;
    regs->_A = (uVar3 ^ regs->_A) & uVar5 ^ regs->_A;
    break;
  case PLB:
    uVar7 = *(int *)&regs->_S + 1;
    regs->_S = (uint16_t)uVar7;
    uVar7 = uVar7 & 0xffff;
    bVar1 = regs->_memory[(ulong)uVar7 + 0x7e0000];
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      uVar7 = uVar7 | 0x7e0000;
      (*regs->_read_function)(regs->_callback_context,uVar7,uVar7,(uint32_t)bVar1,1,STACK_RELATIVE);
    }
    regs->_P = regs->_P & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
    regs->_DB = bVar1;
    break;
  case PLD:
    uVar7 = *(int *)&regs->_S + 2;
    regs->_S = (uint16_t)uVar7;
    uVar9 = (uVar7 & 0xffff) - 1;
    uVar7 = uVar9 & 0xffffff | 0x7e0000;
    uVar3 = *(ushort *)(regs->_memory + uVar7);
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      (*regs->_read_function)
                (regs->_callback_context,uVar9 | 0x7e0000,uVar7,(uint32_t)uVar3,2,STACK_RELATIVE);
    }
    regs->_P = regs->_P & 0xff7d | (uVar3 >> 8 & 0x80) + (ushort)(uVar3 == 0) * 2;
    regs->_DP = uVar3;
    break;
  case PLP:
    uVar7 = *(int *)&regs->_S + 1;
    regs->_S = (uint16_t)uVar7;
    uVar7 = uVar7 & 0xffff;
    bVar1 = regs->_memory[(ulong)uVar7 + 0x7e0000];
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      uVar7 = uVar7 | 0x7e0000;
      (*regs->_read_function)(regs->_callback_context,uVar7,uVar7,(uint32_t)bVar1,1,STACK_RELATIVE);
    }
    *(byte *)&regs->_P = bVar1;
    if ((bVar1 & 0x10) != 0) {
      uVar7._0_2_ = regs->_X;
      uVar7._2_2_ = regs->_Y;
      regs->_X = (short)(uVar7 & 0xff00ff);
      regs->_Y = (short)((uVar7 & 0xff00ff) >> 0x10);
    }
    break;
  case PLX:
    uVar3 = regs->_P;
    if ((uVar3 & 0x10) == 0) {
      uVar5 = regs->_S + 2;
      regs->_S = uVar5;
      uVar9 = uVar5 - 1;
      uVar7 = uVar9 & 0xffffff | 0x7e0000;
      uVar5 = *(ushort *)(regs->_memory + uVar7);
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar9 | 0x7e0000,uVar7,(uint32_t)uVar5,2,STACK_RELATIVE);
        uVar3 = regs->_P;
      }
      regs->_P = uVar3 & 0xff7d | (uVar5 >> 8 & 0x80) + (ushort)(uVar5 == 0) * 2;
      regs->_X = uVar5;
    }
    else {
      uVar5 = regs->_S + 1;
      regs->_S = uVar5;
      bVar1 = regs->_memory[(ulong)uVar5 + 0x7e0000];
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar5 | 0x7e0000,uVar5 | 0x7e0000,(uint32_t)bVar1,1,
                   STACK_RELATIVE);
        uVar3 = regs->_P;
      }
      regs->_P = uVar3 & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
      *(byte *)&regs->_X = bVar1;
    }
    break;
  case PLY:
    uVar3 = regs->_P;
    if ((uVar3 & 0x10) == 0) {
      uVar5 = regs->_S + 2;
      regs->_S = uVar5;
      uVar9 = uVar5 - 1;
      uVar7 = uVar9 & 0xffffff | 0x7e0000;
      uVar5 = *(ushort *)(regs->_memory + uVar7);
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar9 | 0x7e0000,uVar7,(uint32_t)uVar5,2,STACK_RELATIVE);
        uVar3 = regs->_P;
      }
      regs->_P = uVar3 & 0xff7d | (uVar5 >> 8 & 0x80) + (ushort)(uVar5 == 0) * 2;
      regs->_Y = uVar5;
    }
    else {
      uVar5 = regs->_S + 1;
      regs->_S = uVar5;
      bVar1 = regs->_memory[(ulong)uVar5 + 0x7e0000];
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar5 | 0x7e0000,uVar5 | 0x7e0000,(uint32_t)bVar1,1,
                   STACK_RELATIVE);
        uVar3 = regs->_P;
      }
      regs->_P = uVar3 & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
      *(byte *)&regs->_Y = bVar1;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

inline bool push_pull(EmulateRegisters &regs, const Operation op) {
	// Pushes does not set any flags
	// Most pulls set nz

	if (op == Operation::PHA) {
		if (memory16(regs)) {
			push_word_stack(regs, regs.A());
		} else {
			push_byte_stack(regs, (uint8_t)regs.A(0xFF));
		}
	} else if (op == Operation::PHB) {
		push_byte_stack(regs, regs.DB());
	} else if (op == Operation::PHD) {
		push_word_stack(regs, regs.DP());
	} else if (op == Operation::PHK) {
		push_byte_stack(regs, regs.PC(0xFF0000)>>16);
	} else if (op == Operation::PHP) {
		push_byte_stack(regs, (uint8_t)regs.P(0xFF));	
	} else if (op == Operation::PHX) {
		if (index16(regs)) {
			push_word_stack(regs, regs.X());
		} else {
			push_byte_stack(regs, (uint8_t)regs.X(0xFF));
		}
	} else if (op == Operation::PHY) {
		if (index16(regs)) {
			push_word_stack(regs, regs.Y());
		} else {
			push_byte_stack(regs, (uint8_t)regs.Y(0xFF));
		}
	} else if (op == Operation::PLA) {
		bool wide = memory16(regs);
		uint16_t value = wide ? pop_word_stack(regs) : pop_byte_stack(regs);
		regs.set_A(set_nz_flags(regs, value, wide), wide ? 0xFFFF : 0xFF);
	} else if (op == Operation::PLB) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_DB((uint8_t)set_nz_flags(regs, value, false));
	} else if (op == Operation::PLD) {
		uint16_t value = pop_word_stack(regs);
		regs.set_DP(set_nz_flags(regs, value, true));
	} else if (op == Operation::PLP) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_P(set_nz_flags(regs, value, false), 0xFF);
		// TODO: Can PLP affect emulation bit?
		if (!index16(regs)) {
			regs.set_X(0, 0xFF00);
			regs.set_Y(0, 0xFF00);
		}
	} else if (op == Operation::PLX) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_X(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_X(set_nz_flags(regs, value, false), 0xFF);
		}
	} else if (op == Operation::PLY) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, false), 0xFF);
		}
	} else {
		// Not push-pull
		return false;
	}
	// We handled it!
	return true;
}